

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void take_line_escaped_newline(Env *env)

{
  _Bool _Var1;
  bool bVar2;
  Env *env_local;
  
  while( true ) {
    while( true ) {
      _Var1 = not_eof(env);
      bVar2 = false;
      if (_Var1) {
        _Var1 = is_newline(env->lexer->lookahead);
        bVar2 = false;
        if (!_Var1) {
          bVar2 = env->lexer->lookahead != 0x5c;
        }
      }
      if (!bVar2) break;
      advance(env);
    }
    if (env->lexer->lookahead != 0x5c) break;
    advance(env);
    _Var1 = is_space_or_tab(env->lexer->lookahead);
    if (_Var1) {
      while (_Var1 = is_space_or_tab(env->lexer->lookahead), _Var1) {
        advance(env);
      }
      _Var1 = is_newline(env->lexer->lookahead);
      if (_Var1) {
        advance(env);
      }
    }
    else {
      advance(env);
    }
  }
  return;
}

Assistant:

static void take_line_escaped_newline(Env *env) {
  for (;;) {
    while (not_eof(env) && !is_newline(PEEK) && PEEK != '\\') S_ADVANCE;
    if (PEEK == '\\') {
      S_ADVANCE;
      if (is_space_or_tab(PEEK)) {
        while (is_space_or_tab(PEEK)) S_ADVANCE;
        if (is_newline(PEEK)) S_ADVANCE;
      }
      else S_ADVANCE;
    }
    else return;
  }
}